

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall CGL::ImageBuffer::ImageBuffer(ImageBuffer *this,size_t w,size_t h)

{
  size_type in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x155ca7);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(in_RSI,in_RDX);
  return;
}

Assistant:

ImageBuffer(size_t w, size_t h) : w(w), h(h) { data.resize(w * h); }